

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

Token * embree::Token::Sym(string *str)

{
  string *in_RSI;
  Token *in_RDI;
  ParseLocation *in_stack_ffffffffffffff88;
  Token *str_00;
  Token *in_stack_ffffffffffffffa0;
  string local_30 [48];
  
  str_00 = in_RDI;
  std::__cxx11::string::string(local_30,in_RSI);
  ParseLocation::ParseLocation((ParseLocation *)in_RDI);
  Token(in_stack_ffffffffffffffa0,(string *)str_00,(Type)((ulong)in_RDI >> 0x20),
        in_stack_ffffffffffffff88);
  ParseLocation::~ParseLocation((ParseLocation *)0x41b496);
  std::__cxx11::string::~string(local_30);
  return str_00;
}

Assistant:

static Token Sym(std::string str) { return Token(str,TY_SYMBOL); }